

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sentencepiece_model.pb.cc
# Opt level: O2

bool sentencepiece::ModelProto_SentencePiece_Type_Parse
               (ConstStringParam name,ModelProto_SentencePiece_Type *value)

{
  bool bVar1;
  int *in_R9;
  StringPiece name_00;
  int int_value;
  
  name_00.length_ = (stringpiece_ssize_type)&int_value;
  name_00.ptr_ = (char *)name->_M_string_length;
  bVar1 = google::protobuf::internal::LookUpEnumValue
                    ((internal *)ModelProto_SentencePiece_Type_entries,(EnumEntry *)0x6,
                     (size_t)(name->_M_dataplus)._M_p,name_00,in_R9);
  if (bVar1) {
    *value = int_value;
  }
  return bVar1;
}

Assistant:

bool ModelProto_SentencePiece_Type_Parse(
    ::PROTOBUF_NAMESPACE_ID::ConstStringParam name, ModelProto_SentencePiece_Type* value) {
  int int_value;
  bool success = ::PROTOBUF_NAMESPACE_ID::internal::LookUpEnumValue(
      ModelProto_SentencePiece_Type_entries, 6, name, &int_value);
  if (success) {
    *value = static_cast<ModelProto_SentencePiece_Type>(int_value);
  }
  return success;
}